

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O1

bool __thiscall google::protobuf::MessageLite::AppendPartialToString(MessageLite *this,Cord *output)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  ulong uVar4;
  CordRepFlat *pCVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  LogMessageData *extraout_RAX;
  Nonnull<const_char_*> pcVar6;
  sbyte sVar7;
  _func_int **pp_Var8;
  long lVar9;
  ulong uVar10;
  undefined1 *v2;
  byte bVar11;
  int iVar12;
  undefined1 *puVar13;
  sbyte sVar14;
  int iVar15;
  _Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false> v2_00;
  _Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false> _Var16;
  string_view str;
  Span<char> SVar17;
  CordBuffer buffer;
  CordOutputStream output_stream;
  EpsCopyOutputStream out;
  anon_union_16_2_39e9c77e_for_Rep_0 local_108;
  anon_union_16_2_b9f6da03_for_Rep_1 local_f8;
  anon_union_16_2_b9f6da03_for_Rep_1 local_e8;
  undefined1 local_d8 [24];
  CordOutputStream local_c0;
  anon_union_16_2_39e9c77e_for_Rep_0 local_88;
  undefined1 local_70 [48];
  CordOutputStream *local_40;
  undefined2 local_38;
  bool local_36;
  bool local_35;
  _func_int **len;
  LogMessageData *v1;
  
  iVar2 = (*this->_vptr_MessageLite[3])();
  len = (_func_int **)CONCAT44(extraout_var,iVar2);
  bVar11 = (output->contents_).data_.rep_.field_0.data[0];
  uVar4 = (ulong)(char)bVar11;
  if ((uVar4 & 1) == 0) {
    uVar10 = uVar4 >> 1;
  }
  else {
    uVar10 = ((output->contents_).data_.rep_.field_0.as_tree.rep)->length;
  }
  if (((ulong)len & 0xffffffff80000000) != 0) {
    absl::lts_20250127::log_internal::LogMessage::LogMessage
              ((LogMessage *)local_70,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message_lite.cc"
               ,0x296);
    str._M_str = "Exceeded maximum protobuf size of 2GB: ";
    str._M_len = 0x27;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
              ((LogMessage *)local_70,str);
    local_c0.super_ZeroCopyOutputStream._vptr_ZeroCopyOutputStream = len;
    absl::lts_20250127::log_internal::LogMessage::operator<<<unsigned_long,_0>
              ((LogMessage *)local_70,(unsigned_long *)&local_c0);
    absl::lts_20250127::log_internal::LogMessage::~LogMessage((LogMessage *)local_70);
    return false;
  }
  if ((bVar11 & 1) == 0) {
    uVar4 = uVar4 >> 1;
  }
  else {
    uVar4 = ((output->contents_).data_.rep_.field_0.as_tree.rep)->length;
  }
  if (uVar4 == 0) {
    if (len < &DAT_00000010) {
      local_108.data[0] = 1;
      local_108.as_tree.cordz_info._1_7_ = 0;
      local_108.data[8] = '\0';
      local_108._9_4_ = 0;
      local_108._13_2_ = 0;
      local_108.data[0xf] = '\0';
    }
    else {
      pCVar5 = absl::lts_20250127::cord_internal::CordRepFlat::NewImpl<4096ul>((size_t)len);
      (pCVar5->super_CordRep).length = 0;
      local_108.data[0] = (char)pCVar5;
      local_108.as_tree.cordz_info._1_7_ = (undefined7)((ulong)pCVar5 >> 8);
    }
  }
  else {
    absl::lts_20250127::Cord::GetAppendBufferSlowPath
              ((Cord *)&local_108.as_tree,(size_t)output,0,(size_t)len);
  }
  if ((local_108.data[0] & 1U) == 0) {
    SVar17 = absl::lts_20250127::CordBuffer::Rep::long_available((Rep *)&local_108.as_tree);
  }
  else {
    SVar17 = absl::lts_20250127::CordBuffer::Rep::short_available((Rep *)&local_108.as_tree);
  }
  v2_00._M_head_impl = (LogMessageData *)SVar17.ptr_;
  v2 = (undefined1 *)(uVar10 + (long)len);
  iVar3 = (int)SVar17.len_;
  if (len <= (_func_int **)SVar17.len_) {
    local_36 = (bool)(io::CodedOutputStream::default_serialization_deterministic_ & 1);
    local_70._0_8_ = (long)iVar3 + (long)v2_00._M_head_impl;
    local_70._8_8_ =
         (__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
          )0x0;
    local_40 = (CordOutputStream *)0x0;
    local_38._0_1_ = false;
    local_38._1_1_ = false;
    local_35 = false;
    iVar3 = (*this->_vptr_MessageLite[5])(this,v2_00._M_head_impl);
    v1 = (LogMessageData *)CONCAT44(extraout_var_00,iVar3);
    v2_00._M_head_impl = (LogMessageData *)((long)v2_00._M_head_impl + (long)len);
    if (v1 != v2_00._M_head_impl) goto LAB_00fe7c86;
    pcVar6 = (Nonnull<const_char_*>)0x0;
    goto LAB_00fe790c;
  }
  uVar10 = 0xf;
  uVar4 = 0xf;
  if ((local_108.data[0] & 1U) == 0) {
    bVar11 = *(byte *)(CONCAT71(local_108.as_tree.cordz_info._1_7_,local_108.data[0]) + 0xc);
    iVar12 = -0xb8000;
    if (bVar11 < 0xbb) {
      iVar12 = -0xe80;
    }
    sVar14 = 0xc;
    if (bVar11 < 0xbb) {
      sVar14 = 6;
    }
    iVar15 = -0x10;
    if (0x42 < bVar11) {
      iVar15 = iVar12;
    }
    sVar7 = 3;
    if (0x42 < bVar11) {
      sVar7 = sVar14;
    }
    uVar4 = (ulong)(int)(((uint)bVar11 << sVar7) + iVar15 + -0xd);
  }
  if ((local_108.data[0] & 1U) == 0) {
    bVar11 = *(byte *)(CONCAT71(local_108.as_tree.cordz_info._1_7_,local_108.data[0]) + 0xc);
    iVar12 = -0xb8000;
    if (bVar11 < 0xbb) {
      iVar12 = -0xe80;
    }
    sVar14 = 0xc;
    if (bVar11 < 0xbb) {
      sVar14 = 6;
    }
    iVar15 = -0x10;
    if (0x42 < bVar11) {
      iVar15 = iVar12;
    }
    sVar7 = 3;
    if (0x42 < bVar11) {
      sVar7 = sVar14;
    }
    uVar10 = (ulong)(int)(((uint)bVar11 << sVar7) + iVar15 + -0xd);
  }
  if (uVar10 < uVar4) {
    do {
      AppendPartialToString();
      v1 = extraout_RAX;
LAB_00fe7c86:
      pcVar6 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                         (v1,v2_00._M_head_impl,
                          "static_cast<const void*>(res) == static_cast<const void*>(target + size)"
                         );
LAB_00fe790c:
      if (pcVar6 != (Nonnull<const_char_*>)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_c0,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message_lite.cc"
                   ,0x2a7,pcVar6);
        goto LAB_00fe7cf9;
      }
      pp_Var8 = (_func_int **)&DAT_0000000f;
      if ((local_108.data[0] & 1U) == 0) {
        bVar11 = *(byte *)(CONCAT71(local_108.as_tree.cordz_info._1_7_,local_108.data[0]) + 0xc);
        iVar3 = -0xb8000;
        if (bVar11 < 0xbb) {
          iVar3 = -0xe80;
        }
        sVar14 = 0xc;
        if (bVar11 < 0xbb) {
          sVar14 = 6;
        }
        iVar12 = -0x10;
        if (0x42 < bVar11) {
          iVar12 = iVar3;
        }
        sVar7 = 3;
        if (0x42 < bVar11) {
          sVar7 = sVar14;
        }
        pp_Var8 = (_func_int **)(long)(int)(((uint)bVar11 << sVar7) + iVar12 + -0xd);
      }
      if (len <= pp_Var8) {
        if ((local_108.data[0] & 1U) == 0) {
          lVar9 = *(long *)CONCAT71(local_108.as_tree.cordz_info._1_7_,local_108.data[0]);
        }
        else {
          lVar9 = (long)(local_108.data[0] >> 1);
        }
        puVar13 = (undefined1 *)0xf;
        if ((local_108.data[0] & 1U) == 0) {
          bVar11 = *(byte *)(CONCAT71(local_108.as_tree.cordz_info._1_7_,local_108.data[0]) + 0xc);
          iVar3 = -0xb8000;
          if (bVar11 < 0xbb) {
            iVar3 = -0xe80;
          }
          sVar14 = 0xc;
          if (bVar11 < 0xbb) {
            sVar14 = 6;
          }
          iVar12 = -0x10;
          if (0x42 < bVar11) {
            iVar12 = iVar3;
          }
          sVar7 = 3;
          if (0x42 < bVar11) {
            sVar7 = sVar14;
          }
          puVar13 = (undefined1 *)(long)(int)(((uint)bVar11 << sVar7) + iVar12 + -0xd);
        }
        if ((undefined1 *)(lVar9 + (long)len) <= puVar13) goto code_r0x00fe7b3b;
      }
      AppendPartialToString();
    } while( true );
  }
  if ((local_108.data[0] & 1U) == 0) {
    *(ulong *)CONCAT71(local_108.as_tree.cordz_info._1_7_,local_108.data[0]) = uVar4;
  }
  else {
    local_108.data[0] = (char)uVar4 * '\x02' + 1;
  }
  local_88.as_tree.cordz_info = (output->contents_).data_.rep_.field_0.as_tree.cordz_info;
  local_88.as_tree.rep = (output->contents_).data_.rep_.field_0.as_tree.rep;
  (output->contents_).data_.rep_.field_0.as_tree.cordz_info = 0;
  (output->contents_).data_.rep_.field_0.as_tree.rep = (CordRep *)0x0;
  local_f8.short_rep.raw_size = local_108.data[0];
  local_f8._1_7_ = local_108.as_tree.cordz_info._1_7_;
  local_f8.short_rep.data[7] = local_108.data[8];
  local_f8._9_4_ = local_108._9_4_;
  local_f8._13_2_ = local_108._13_2_;
  local_f8.short_rep.data[0xe] = local_108.data[0xf];
  local_108.data[0] = 1;
  io::CordOutputStream::CordOutputStream
            (&local_c0,(Cord *)&local_88.as_tree,(CordBuffer *)&local_f8.long_rep,(size_t)v2);
  if ((local_f8.short_rep.raw_size & 1U) == 0) {
    absl::lts_20250127::cord_internal::CordRepFlat::Delete
              ((CordRep *)CONCAT71(local_f8._1_7_,local_f8.short_rep.raw_size));
  }
  absl::lts_20250127::Cord::~Cord((Cord *)&local_88.as_tree);
  local_36 = (bool)(io::CodedOutputStream::default_serialization_deterministic_ & 1);
  local_38._0_1_ = false;
  local_38._1_1_ = false;
  _Var16._M_head_impl = v2_00._M_head_impl;
  local_70._0_8_ = (char *)((long)v2_00._M_head_impl + -0x10) + ((ulong)SVar17.len_ & 0xffffffff);
  local_70._8_8_ =
       (_Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>)
       (_Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
        )0x0;
  if (iVar3 < 0x11) {
    _Var16._M_head_impl = (LogMessageData *)(local_70 + 0x10);
    local_70._0_8_ = local_70 + (long)iVar3 + 0x10;
    local_70._8_8_ = v2_00._M_head_impl;
  }
  local_35 = false;
  local_40 = &local_c0;
  iVar2 = (*this->_vptr_MessageLite[5])(this,_Var16._M_head_impl,local_70);
  io::EpsCopyOutputStream::Trim
            ((EpsCopyOutputStream *)local_70,(uint8_t *)CONCAT44(extraout_var_01,iVar2));
  bVar1 = local_38._0_1_;
  if (local_38._0_1_ == false) {
    io::CordOutputStream::Consume((CordOutputStream *)local_d8);
    if (((output->contents_).data_.rep_.field_0.data[0] & 1U) != 0) {
      absl::lts_20250127::Cord::InlineRep::UnrefTree(&output->contents_);
    }
    (output->contents_).data_.rep_.field_0.as_tree.cordz_info = local_d8._0_8_;
    (output->contents_).data_.rep_.field_0.as_tree.rep = (CordRep *)local_d8._8_8_;
    local_d8._0_8_ = (_func_int **)0x0;
    local_d8._8_8_ = (CordRep *)0x0;
    absl::lts_20250127::Cord::~Cord((Cord *)local_d8);
    uVar4 = (ulong)(output->contents_).data_.rep_.field_0.data[0];
    if ((uVar4 & 1) == 0) {
      puVar13 = (undefined1 *)(uVar4 >> 1);
    }
    else {
      puVar13 = (undefined1 *)((output->contents_).data_.rep_.field_0.as_tree.rep)->length;
    }
    if (puVar13 == v2) {
      pcVar6 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar6 = absl::lts_20250127::log_internal::MakeCheckOpString<unsigned_long,unsigned_long>
                         ((unsigned_long)puVar13,(unsigned_long)v2,"output->size() == total_size");
    }
    if (pcVar6 != (Nonnull<const_char_*>)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message_lite.cc"
                 ,0x2ba,pcVar6);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)local_d8);
    }
  }
  if ((local_c0.buffer_.rep_.field_0.short_rep.raw_size & 1U) == 0) {
    absl::lts_20250127::cord_internal::CordRepFlat::Delete
              ((CordRep *)
               CONCAT71(local_c0.buffer_.rep_.field_0._1_7_,
                        local_c0.buffer_.rep_.field_0.short_rep.raw_size));
  }
  bVar11 = bVar1 ^ 1;
  absl::lts_20250127::Cord::~Cord(&local_c0.cord_);
LAB_00fe7c03:
  if ((local_108.data[0] & 1U) == 0) {
    absl::lts_20250127::cord_internal::CordRepFlat::Delete
              ((CordRep *)CONCAT71(local_108.as_tree.cordz_info._1_7_,local_108.data[0]));
  }
  return (bool)bVar11;
code_r0x00fe7b3b:
  if ((local_108.data[0] & 1U) == 0) {
    *(long *)CONCAT71(local_108.as_tree.cordz_info._1_7_,local_108.data[0]) =
         (long)(*(long *)CONCAT71(local_108.as_tree.cordz_info._1_7_,local_108.data[0]) + (long)len)
    ;
  }
  else {
    local_108.data[0] = local_108.data[0] + (char)iVar2 * '\x02';
  }
  local_e8.short_rep.raw_size = local_108.data[0];
  local_e8._1_7_ = local_108.as_tree.cordz_info._1_7_;
  local_e8.short_rep.data[7] = local_108.data[8];
  local_e8._9_4_ = local_108._9_4_;
  local_e8._13_2_ = local_108._13_2_;
  local_e8.short_rep.data[0xe] = local_108.data[0xf];
  local_108.data[0] = 1;
  absl::lts_20250127::Cord::Append(output,(CordBuffer *)&local_e8.long_rep);
  if ((local_e8.short_rep.raw_size & 1U) == 0) {
    absl::lts_20250127::cord_internal::CordRepFlat::Delete
              ((CordRep *)CONCAT71(local_e8._1_7_,local_e8.short_rep.raw_size));
  }
  uVar4 = (ulong)(output->contents_).data_.rep_.field_0.data[0];
  if ((uVar4 & 1) == 0) {
    puVar13 = (undefined1 *)(uVar4 >> 1);
  }
  else {
    puVar13 = (undefined1 *)((output->contents_).data_.rep_.field_0.as_tree.rep)->length;
  }
  if (puVar13 == v2) {
    pcVar6 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar6 = absl::lts_20250127::log_internal::MakeCheckOpString<unsigned_long,unsigned_long>
                       ((unsigned_long)puVar13,(unsigned_long)v2,"output->size() == total_size");
  }
  if (pcVar6 != (Nonnull<const_char_*>)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_c0,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message_lite.cc"
               ,0x2aa,pcVar6);
LAB_00fe7cf9:
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_c0);
  }
  bVar11 = 1;
  goto LAB_00fe7c03;
}

Assistant:

bool MessageLite::AppendPartialToString(absl::Cord* output) const {
  // For efficiency, we'd like to pass a size hint to CordOutputStream with
  // the exact total size expected.
  const size_t size = ByteSizeLong();
  const size_t total_size = size + output->size();
  if (size > INT_MAX) {
    ABSL_LOG(ERROR) << "Exceeded maximum protobuf size of 2GB: " << size;
    return false;
  }


  // Allocate a CordBuffer (which may utilize private capacity in 'output').
  absl::CordBuffer buffer = output->GetAppendBuffer(size);
  absl::Span<char> available = buffer.available();
  auto target = reinterpret_cast<uint8_t*>(available.data());
  if (available.size() >= size) {
    // Use EpsCopyOutputStream with full available capacity, as serialization
    // may in the future use the extra slop bytes if available.
    io::EpsCopyOutputStream out(
        target, static_cast<int>(available.size()),
        io::CodedOutputStream::IsDefaultSerializationDeterministic());
    auto res = _InternalSerialize(target, &out);
    ABSL_DCHECK_EQ(static_cast<const void*>(res),
                   static_cast<const void*>(target + size));
    buffer.IncreaseLengthBy(size);
    output->Append(std::move(buffer));
    ABSL_DCHECK_EQ(output->size(), total_size);
    return true;
  }

  // Donate the buffer to the CordOutputStream with length := capacity.
  // This follows the eager `EpsCopyOutputStream` initialization logic.
  buffer.SetLength(buffer.capacity());
  io::CordOutputStream output_stream(std::move(*output), std::move(buffer),
                                     total_size);
  io::EpsCopyOutputStream out(
      target, static_cast<int>(available.size()), &output_stream,
      io::CodedOutputStream::IsDefaultSerializationDeterministic(), &target);
  target = _InternalSerialize(target, &out);
  out.Trim(target);
  if (out.HadError()) return false;
  *output = output_stream.Consume();
  ABSL_DCHECK_EQ(output->size(), total_size);
  return true;
}